

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

bool caffe::UpgradeNetAsNeeded(string *param_file,NetParameter *param)

{
  bool bVar1;
  undefined1 local_170 [8];
  NetParameter original_param_1;
  undefined1 local_c0 [8];
  NetParameter original_param;
  bool success;
  NetParameter *param_local;
  string *param_file_local;
  
  original_param._159_1_ = 1;
  bVar1 = NetNeedsV0ToV1Upgrade(param);
  if (bVar1) {
    NetParameter::NetParameter((NetParameter *)local_c0,param);
    bVar1 = UpgradeV0Net((NetParameter *)local_c0,param);
    if (!bVar1) {
      original_param._159_1_ = 0;
    }
    NetParameter::~NetParameter((NetParameter *)local_c0);
  }
  bVar1 = NetNeedsDataUpgrade(param);
  if (bVar1) {
    UpgradeNetDataTransformation(param);
  }
  bVar1 = NetNeedsV1ToV2Upgrade(param);
  if (bVar1) {
    NetParameter::NetParameter((NetParameter *)local_170,param);
    bVar1 = UpgradeV1Net((NetParameter *)local_170,param);
    if (!bVar1) {
      original_param._159_1_ = 0;
    }
    NetParameter::~NetParameter((NetParameter *)local_170);
  }
  bVar1 = NetNeedsInputUpgrade(param);
  if (bVar1) {
    UpgradeNetInput(param);
  }
  bVar1 = NetNeedsBatchNormUpgrade(param);
  if (bVar1) {
    UpgradeNetBatchNorm(param);
  }
  return (bool)(original_param._159_1_ & 1);
}

Assistant:

bool UpgradeNetAsNeeded(const string& param_file, NetParameter* param) {
  bool success = true;
  if (NetNeedsV0ToV1Upgrade(*param)) {
    /*
    NetParameter was specified using the old style (V0LayerParameter); try to
    upgrade it. Attempting to upgrade input file specified using deprecated V0LayerParameter.
    */
    NetParameter original_param(*param);
    if (!UpgradeV0Net(original_param, param)) {
      success = false;
      /*
       Warning: had one or more problems upgrading V0NetParameter to NetParameter (see above); continuing anyway.
       */
    } else {
      /*
       Successfully upgraded file specified using deprecated V0LayerParameter.
      */
    }
    /*
     Note that future Caffe releases will not support V0NetParameter; use ./build/tools/upgrade_net_proto_text for
     prototxt and ./build/tools/upgrade_net_proto_binary for model
     weights upgrade this and any other net protos to the new format.
    */
  }
  // NetParameter uses old style data transformation fields; try to upgrade it.
  if (NetNeedsDataUpgrade(*param)) {
    /*
     Attempting to upgrade input file specified using deprecated transformation parameters.
     */
    UpgradeNetDataTransformation(param);
    /*
     Successfully upgraded file specified using deprecated data transformation parameters.
     Note that future Caffe releases will only support transform_param messages for transformation fields.
     */
  }
  if (NetNeedsV1ToV2Upgrade(*param)) {
    /*
     Attempting to upgrade input file specified using deprecated V1LayerParameter.
    */
    NetParameter original_param(*param);
    if (!UpgradeV1Net(original_param, param)) {
      success = false;
      /*
       Warning: had one or more problems upgrading V1LayerParameter (see above); continuing anyway.
       */
    } else {
      /*
       Successfully upgraded file specified using deprecated V1LayerParameter.
      */
    }
  }
  // NetParameter uses old style input fields; try to upgrade it.
  if (NetNeedsInputUpgrade(*param)) {
    /*
     Attempting to upgrade input file specified using deprecated input fields.
     */
    UpgradeNetInput(param);
    /*
     Successfully upgraded file specified using deprecated input fields.
     Note that future Caffe releases will only support input layers and not input fields.
     */
  }
  // NetParameter uses old style batch norm layers; try to upgrade it.
  if (NetNeedsBatchNormUpgrade(*param)) {
    /*
     Attempting to upgrade batch norm layers using deprecated params:
     */
    UpgradeNetBatchNorm(param);
    /*
     Successfully upgraded batch norm layers using deprecated params.
     */
  }
  return success;
}